

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmaster.c
# Opt level: O1

void select_scan_parameters(j_compress_ptr cinfo)

{
  jpeg_scan_info *pjVar1;
  jpeg_error_mgr *pjVar2;
  undefined1 auVar3 [16];
  int iVar4;
  jpeg_component_info *pjVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  long lVar9;
  
  if (cinfo->scan_info == (jpeg_scan_info *)0x0) {
    iVar4 = cinfo->num_components;
    if (4 < iVar4) {
      pjVar2 = cinfo->err;
      pjVar2->msg_code = 0x1b;
      (pjVar2->msg_parm).i[0] = iVar4;
      (cinfo->err->msg_parm).i[1] = 4;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    iVar4 = cinfo->num_components;
    cinfo->comps_in_scan = iVar4;
    auVar3 = _DAT_00219ba0;
    if (0 < (long)iVar4) {
      pjVar5 = cinfo->comp_info;
      lVar6 = (long)iVar4 + -1;
      auVar7._8_4_ = (int)lVar6;
      auVar7._0_8_ = lVar6;
      auVar7._12_4_ = (int)((ulong)lVar6 >> 0x20);
      lVar6 = 0;
      auVar7 = auVar7 ^ _DAT_00219ba0;
      auVar8 = _DAT_00219b90;
      do {
        auVar10 = auVar8 ^ auVar3;
        if ((bool)(~(auVar10._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar10._0_4_ ||
                    auVar7._4_4_ < auVar10._4_4_) & 1)) {
          *(jpeg_component_info **)((long)cinfo->cur_comp_info + lVar6) = pjVar5;
        }
        if ((auVar10._12_4_ != auVar7._12_4_ || auVar10._8_4_ <= auVar7._8_4_) &&
            auVar10._12_4_ <= auVar7._12_4_) {
          *(jpeg_component_info **)((long)cinfo->cur_comp_info + lVar6 + 8) = pjVar5 + 1;
        }
        lVar9 = auVar8._8_8_;
        auVar8._0_8_ = auVar8._0_8_ + 2;
        auVar8._8_8_ = lVar9 + 2;
        lVar6 = lVar6 + 0x10;
        pjVar5 = pjVar5 + 2;
      } while ((ulong)(iVar4 + 1U >> 1) << 4 != lVar6);
    }
  }
  else {
    pjVar1 = cinfo->scan_info + *(int *)((long)&cinfo->master[1].pass_startup + 4);
    iVar4 = pjVar1->comps_in_scan;
    cinfo->comps_in_scan = iVar4;
    if (0 < (long)iVar4) {
      pjVar5 = cinfo->comp_info;
      lVar6 = 0;
      do {
        cinfo->cur_comp_info[lVar6] = pjVar5 + pjVar1->component_index[lVar6];
        lVar6 = lVar6 + 1;
      } while (iVar4 != lVar6);
    }
    if (cinfo->progressive_mode != 0) {
      iVar4 = pjVar1->Se;
      cinfo->Ss = pjVar1->Ss;
      cinfo->Se = iVar4;
      cinfo->Ah = pjVar1->Ah;
      iVar4 = pjVar1->Al;
      goto LAB_001da7bc;
    }
  }
  iVar4 = 0;
  cinfo->Ss = 0;
  cinfo->Se = cinfo->block_size * cinfo->block_size + -1;
  cinfo->Ah = 0;
LAB_001da7bc:
  cinfo->Al = iVar4;
  return;
}

Assistant:

LOCAL(void)
select_scan_parameters (j_compress_ptr cinfo)
/* Set up the scan parameters for the current scan */
{
  int ci;

#ifdef C_MULTISCAN_FILES_SUPPORTED
  if (cinfo->scan_info != NULL) {
    /* Prepare for current scan --- the script is already validated */
    my_master_ptr master = (my_master_ptr) cinfo->master;
    const jpeg_scan_info * scanptr = cinfo->scan_info + master->scan_number;

    cinfo->comps_in_scan = scanptr->comps_in_scan;
    for (ci = 0; ci < scanptr->comps_in_scan; ci++) {
      cinfo->cur_comp_info[ci] =
	&cinfo->comp_info[scanptr->component_index[ci]];
    }
    if (cinfo->progressive_mode) {
      cinfo->Ss = scanptr->Ss;
      cinfo->Se = scanptr->Se;
      cinfo->Ah = scanptr->Ah;
      cinfo->Al = scanptr->Al;
      return;
    }
  }
  else
#endif
  {
    /* Prepare for single sequential-JPEG scan containing all components */
    if (cinfo->num_components > MAX_COMPS_IN_SCAN)
      ERREXIT2(cinfo, JERR_COMPONENT_COUNT, cinfo->num_components,
	       MAX_COMPS_IN_SCAN);
    cinfo->comps_in_scan = cinfo->num_components;
    for (ci = 0; ci < cinfo->num_components; ci++) {
      cinfo->cur_comp_info[ci] = &cinfo->comp_info[ci];
    }
  }
  cinfo->Ss = 0;
  cinfo->Se = cinfo->block_size * cinfo->block_size - 1;
  cinfo->Ah = 0;
  cinfo->Al = 0;
}